

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dac.c
# Opt level: O0

void dac_dsp(t_dac *x,t_signal **sp)

{
  int iVar1;
  int iVar2;
  t_signal **pptStack_30;
  int ch;
  t_signal **sp2;
  t_int *ip;
  t_int i;
  t_signal **sp_local;
  t_dac *x_local;
  
  sp2 = (t_signal **)x->x_vec;
  pptStack_30 = sp;
  ip = (t_int *)x->x_n;
  while (ip != (t_int *)0x0) {
    iVar1 = (int)*sp2 + -1;
    if ((*pptStack_30)->s_n == 0x40) {
      if ((-1 < iVar1) && (iVar2 = sys_get_outchannels(), iVar1 < iVar2)) {
        dsp_add(plus_perform,4,(pd_maininstance.pd_stuff)->st_soundout + iVar1 * 0x40,
                (*pptStack_30)->s_vec,(pd_maininstance.pd_stuff)->st_soundout + iVar1 * 0x40,0x40);
      }
    }
    else {
      pd_error((void *)0x0,"dac~: bad vector size");
    }
    sp2 = sp2 + 1;
    pptStack_30 = pptStack_30 + 1;
    ip = (t_int *)((long)ip + -1);
  }
  return;
}

Assistant:

static void dac_dsp(t_dac *x, t_signal **sp)
{
    t_int i, *ip;
    t_signal **sp2;
    for (i = x->x_n, ip = x->x_vec, sp2 = sp; i--; ip++, sp2++)
    {
        int ch = (int)(*ip - 1);
        if ((*sp2)->s_n != DEFDACBLKSIZE)
            pd_error(0, "dac~: bad vector size");
        else if (ch >= 0 && ch < sys_get_outchannels())
            dsp_add(plus_perform, 4, STUFF->st_soundout + DEFDACBLKSIZE*ch,
                (*sp2)->s_vec, STUFF->st_soundout + DEFDACBLKSIZE*ch, (t_int)DEFDACBLKSIZE);
    }
}